

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

void __thiscall
helics::ValueFederateManager::addAlias
          (ValueFederateManager *this,Input *inp,string_view shortcutName)

{
  InterfaceHandle *existingValue;
  Core *pCVar1;
  string *psVar2;
  InvalidIdentifier *this_00;
  char *pcVar3;
  size_t sVar4;
  string_view message;
  handle inpHandle;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  handle local_58;
  handle local_40;
  
  pcVar3 = shortcutName._M_str;
  sVar4 = shortcutName._M_len;
  local_68._M_len = sVar4;
  local_68._M_str = pcVar3;
  if ((inp->super_Interface).handle.hid != -1700000000) {
    existingValue = &(inp->super_Interface).handle;
    pCVar1 = this->coreObject;
    psVar2 = Interface::getName_abi_cxx11_(&inp->super_Interface);
    (*pCVar1->_vptr_Core[0x45])
              (pCVar1,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p,sVar4,pcVar3);
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
    ::lock(&local_40,&this->inputs);
    gmlc::containers::
    DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::
    addSearchTerm(local_40.data,shortcutName,existingValue);
    gmlc::libguarded::
    shared_guarded_opt<std::multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>_>_>,_std::shared_mutex>
    ::lock(&local_58,&this->targetIDs);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
    ::
    _M_emplace_equal<std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,helics::InterfaceHandle>,std::_Select1st<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,helics::InterfaceHandle>>>
                *)local_58.data,&local_68,existingValue);
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_58.m_handle_lock);
    std::unique_lock<std::mutex>::~unique_lock(&local_40.m_handle_lock);
    return;
  }
  this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "input is invalid";
  message._M_len = 0x10;
  InvalidIdentifier::InvalidIdentifier(this_00,message);
  __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void ValueFederateManager::addAlias(const Input& inp, std::string_view shortcutName)
{
    if (inp.isValid()) {
        coreObject->addAlias(inp.getName(), shortcutName);
        auto inpHandle = inputs.lock();
        inpHandle->addSearchTerm(shortcutName, inp.handle);
        targetIDs.lock()->emplace(shortcutName, inp.handle);
    } else {
        throw(InvalidIdentifier("input is invalid"));
    }
}